

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

void ssh1_connection_free(PacketProtocolLayer *ppl)

{
  prompts_t *p;
  void *ptr;
  X11FakeAuth *auth;
  ssh_rportfwd *rpf;
  
  conf_free((Conf *)ppl[-3].interactor);
  ptr = delpos234(*(tree234 **)&ppl[-3].remote_bugs,0);
  while (ptr != (void *)0x0) {
    if (*(undefined8 **)((long)ptr + 0x20) != (undefined8 *)0x0) {
      (**(code **)**(undefined8 **)((long)ptr + 0x20))();
    }
    safefree(ptr);
    ptr = delpos234(*(tree234 **)&ppl[-3].remote_bugs,0);
  }
  freetree234(*(tree234 **)&ppl[-3].remote_bugs);
  if (ppl[-2].in_pq != (PktInQueue *)0x0) {
    (*(code *)(((ppl[-2].in_pq)->pqb).end.next)->next)();
  }
  if ((X11Display *)ppl[-2].seat != (X11Display *)0x0) {
    x11_free_display((X11Display *)ppl[-2].seat);
  }
  while (auth = (X11FakeAuth *)delpos234((tree234 *)ppl[-2].ssh,0), auth != (X11FakeAuth *)0x0) {
    x11_free_fake_auth(auth);
  }
  freetree234((tree234 *)ppl[-2].ssh);
  while (rpf = (ssh_rportfwd *)delpos234(*(tree234 **)&ppl[-2].remote_bugs,0),
        rpf != (ssh_rportfwd *)0x0) {
    free_rportfwd(rpf);
  }
  freetree234(*(tree234 **)&ppl[-2].remote_bugs);
  portfwdmgr_free((PortFwdManager *)ppl[-1].vt);
  p = (prompts_t *)ppl[-1].ic_process_queue.ctx;
  if (p != (prompts_t *)0x0) {
    free_prompts(p);
  }
  delete_callbacks_for_context(&ppl[-3].seat);
  safefree(&ppl[-3].seat);
  return;
}

Assistant:

static void ssh1_connection_free(PacketProtocolLayer *ppl)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);
    struct X11FakeAuth *auth;
    struct ssh1_channel *c;
    struct ssh_rportfwd *rpf;

    conf_free(s->conf);

    while ((c = delpos234(s->channels, 0)) != NULL)
        ssh1_channel_free(c);
    freetree234(s->channels);
    if (s->mainchan_chan)
        chan_free(s->mainchan_chan);

    if (s->x11disp)
        x11_free_display(s->x11disp);
    while ((auth = delpos234(s->x11authtree, 0)) != NULL)
        x11_free_fake_auth(auth);
    freetree234(s->x11authtree);

    while ((rpf = delpos234(s->rportfwds, 0)) != NULL)
        free_rportfwd(rpf);
    freetree234(s->rportfwds);
    portfwdmgr_free(s->portfwdmgr);

    if (s->antispoof_prompt)
        free_prompts(s->antispoof_prompt);

    delete_callbacks_for_context(s);

    sfree(s);
}